

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O1

long longbits(long l)

{
  uint uVar1;
  
  uVar1 = ((uint)l & 0x55555555) + ((uint)l >> 1 & 0x55555555);
  uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333);
  uVar1 = (uVar1 >> 4 & 0x7070707) + (uVar1 & 0x7070707);
  uVar1 = (uVar1 >> 8 & 0xf000f) + (uVar1 & 0xf000f);
  return (ulong)(uVar1 >> 0x10) + (ulong)(uVar1 & 0xffff);
}

Assistant:

long longbits(long l)
{
    /* http://graphics.stanford.edu/~seander/bithacks.html#CountBitsSetParallel */
    long l2;
    l2 = (l  & 0x55555555L) + ((l  & 0xAAAAAAAAL) >>  1);
    l  = (l2 & 0x33333333L) + ((l2 & 0xCCCCCCCCL) >>  2);
    l2 = (l  & 0x0F0F0F0FL) + ((l  & 0xF0F0F0F0L) >>  4);
    l  = (l2 & 0x00FF00FFL) + ((l2 & 0xFF00FF00L) >>  8);
    l2 = (l  & 0x0000FFFFL) + ((l  & 0xFFFF0000L) >> 16);
    return l2;
}